

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QPersistentModelIndex *idx)

{
  QDebug *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebug *in_stack_ffffffffffffff68;
  QDebug *in_stack_ffffffffffffff70;
  QDebug in_stack_ffffffffffffffc0;
  QDebug *in_stack_ffffffffffffffc8;
  QDebug local_28 [2];
  QDebug local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX->stream == (Stream *)0x0) {
    in_stack_ffffffffffffff68 = local_28;
    QDebug::QDebug(in_stack_ffffffffffffff68,in_RSI);
    in_stack_ffffffffffffff70 = (QDebug *)&stack0xffffffffffffffc0;
    QModelIndex::QModelIndex((QModelIndex *)0x7ed524);
    operator<<(in_stack_ffffffffffffffc8,(QModelIndex *)in_stack_ffffffffffffffc0.stream);
    QDebug::~QDebug(in_RDX);
    QDebug::~QDebug(in_RDX);
  }
  else {
    QDebug::QDebug(local_18,in_RSI);
    operator<<(in_stack_ffffffffffffffc8,(QModelIndex *)in_stack_ffffffffffffffc0.stream);
    QDebug::~QDebug(in_RDX);
    QDebug::~QDebug(in_RDX);
  }
  QDebug::QDebug(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QPersistentModelIndex &idx)
{
    if (idx.d)
        dbg << idx.d->index;
    else
        dbg << QModelIndex();
    return dbg;
}